

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

size_t __thiscall proto2_unittest::TestEmptyMessageLite::ByteSizeLong(TestEmptyMessageLite *this)

{
  ulong uVar1;
  anon_union_4_1_493b367e_for_TestEmptyMessageLite_3 aVar2;
  size_t sVar3;
  TestEmptyMessageLite *this_;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = *(size_t *)((uVar1 & 0xfffffffffffffffe) + 0x10);
    aVar2 = SUB84(sVar3,0);
    if (aVar2 != (anon_union_4_1_493b367e_for_TestEmptyMessageLite_3)0x0) goto LAB_00d4498a;
  }
  aVar2 = (anon_union_4_1_493b367e_for_TestEmptyMessageLite_3)0x0;
  if (this->field_0 == (anon_union_4_1_493b367e_for_TestEmptyMessageLite_3)0x0) {
    return sVar3;
  }
LAB_00d4498a:
  this->field_0 = aVar2;
  return sVar3;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }